

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

string * bech32::encodeBasis(string *__return_storage_ptr__,string *hrp,
                            vector<unsigned_char,_std::allocator<unsigned_char>_> *dp,
                            _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_string_ptr_vector<unsigned_char,_std::allocator<unsigned_char>_>_ptr
                            *checksumFunc)

{
  bool bVar1;
  byte *pbVar2;
  runtime_error *this;
  iterator iStack_a8;
  uchar c;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> combined;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> checksum;
  undefined1 local_48 [8];
  string hrpCopy;
  _func_vector<unsigned_char,_std::allocator<unsigned_char>_>_string_ptr_vector<unsigned_char,_std::allocator<unsigned_char>_>_ptr
  *checksumFunc_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dp_local;
  string *hrp_local;
  string *ret;
  
  hrpCopy.field_2._8_8_ = checksumFunc;
  anon_unknown.dwarf_705::rejectHRPTooShort(hrp);
  anon_unknown.dwarf_705::rejectHRPTooLong(hrp);
  anon_unknown.dwarf_705::rejectBothPartsTooLong(hrp,dp);
  anon_unknown.dwarf_705::rejectDataValuesOutOfRange(dp);
  std::__cxx11::string::string((string *)local_48,(string *)hrp);
  anon_unknown.dwarf_705::convertToLowercase((string *)local_48);
  (*(code *)hrpCopy.field_2._8_8_)(local_70,local_48,dp);
  combined.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,'1');
  anon_unknown.dwarf_705::cat
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1,dp,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  std::__cxx11::string::size();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
  iStack_a8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff58);
    if (!bVar1) {
      combined.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1);
      if ((combined.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
      std::__cxx11::string::~string((string *)local_48);
      return __return_storage_ptr__;
    }
    pbVar2 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&__end1);
    if (0x1f < *pbVar2) break;
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(anonymous_namespace)::charset[*pbVar2]);
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end1);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"data part contains invalid character");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string encodeBasis(const std::string &hrp, const std::vector<unsigned char> &dp,
                            std::vector<unsigned char> (*checksumFunc)(const std::string &, const std::vector<unsigned char> &)) {
        rejectHRPTooShort(hrp);
        rejectHRPTooLong(hrp);
        rejectBothPartsTooLong(hrp, dp);
        rejectDataValuesOutOfRange(dp);

        std::string hrpCopy = hrp;
        convertToLowercase(hrpCopy);
        std::vector<unsigned char> checksum = checksumFunc(hrpCopy, dp);
        std::string ret = hrpCopy + '1';
        std::vector<unsigned char> combined = cat(dp, checksum);
        ret.reserve(ret.size() + combined.size());
        for (unsigned char c : combined) {
            if(c > limits::VALID_CHARSET_SIZE - 1)
                throw std::runtime_error("data part contains invalid character");
            ret += charset[c];
        }
        return ret;
    }